

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::M3DImporter::importTextures(M3DImporter *this,M3DWrapper *m3d)

{
  ushort uVar1;
  ushort uVar2;
  m3dtx_t *pmVar3;
  Logger *this_00;
  aiTexture **ppaVar4;
  aiTexture *paVar5;
  aiTexel *paVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t *puVar9;
  uint uVar10;
  uint uVar11;
  size_t __n;
  ulong uVar12;
  allocator<char> local_491;
  M3DImporter *local_490;
  ulong local_488;
  M3DWrapper *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_438 [4];
  undefined1 local_434 [1028];
  
  local_490 = this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13c,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13d,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  this->mScene->mNumTextures = m3d->m3d_->numtexture;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[21]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
             (char (*) [21])"M3D: importTextures ");
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            (local_438,&local_490->mScene->mNumTextures);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_478._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  uVar12 = (ulong)m3d->m3d_->numtexture;
  if (uVar12 != 0) {
    ppaVar4 = (aiTexture **)operator_new__(uVar12 << 3);
    local_490->mScene->mTextures = ppaVar4;
    uVar12 = 0;
    local_480 = m3d;
    while (uVar12 < local_480->m3d_->numtexture) {
      pmVar3 = local_480->m3d_->texture;
      paVar5 = (aiTexture *)operator_new(0x428);
      paVar5->mWidth = 0;
      paVar5->mHeight = 0;
      paVar5->pcData = (aiTexel *)0x0;
      (paVar5->mFilename).length = 0;
      (paVar5->mFilename).data[0] = '\0';
      memset((paVar5->mFilename).data + 1,0x1b,0x3ff);
      paVar5->achFormatHint[0] = '\0';
      paVar5->achFormatHint[1] = '\0';
      paVar5->achFormatHint[2] = '\0';
      paVar5->achFormatHint[3] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,pmVar3[uVar12].name,&local_491);
      local_488 = uVar12;
      std::operator+(&local_478,&local_458,".png");
      __n = local_478._M_string_length & 0xffffffff;
      if ((local_478._M_string_length & 0xfffffc00) != 0) {
        __n = 0x3ff;
      }
      memcpy(local_434,local_478._M_dataplus._M_p,__n);
      local_434[__n] = 0;
      (paVar5->mFilename).length = (ai_uint32)__n;
      memcpy((paVar5->mFilename).data,local_434,__n);
      (paVar5->mFilename).data[__n] = '\0';
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_458);
      uVar1 = pmVar3[uVar12].w;
      uVar10 = (uint)uVar1;
      if ((((uVar1 == 0) || (pmVar3[uVar12].h == 0)) || (pmVar3[uVar12].f == '\0')) ||
         (pmVar3[uVar12].d == (uint8_t *)0x0)) {
        paVar5->mWidth = 0;
        paVar5->mHeight = 0;
        builtin_strncpy(paVar5->achFormatHint,"png",4);
        paVar5->pcData = (aiTexel *)0x0;
      }
      else {
        paVar5->mWidth = (uint)uVar1;
        uVar2 = pmVar3[uVar12].h;
        uVar11 = (uint)uVar2;
        paVar5->mHeight = (uint)uVar2;
        strcpy(paVar5->achFormatHint,
               &DAT_005d88b8 + *(int *)(m3d_commandtypes[0x25].a + (ulong)pmVar3[uVar12].f * 4 + 6))
        ;
        paVar6 = (aiTexel *)operator_new__((ulong)((uint)uVar2 * (uint)uVar1) << 2);
        paVar5->pcData = paVar6;
        uVar8 = 0;
        for (uVar7 = 0; uVar7 < uVar11 * uVar10; uVar7 = uVar7 + 1) {
          if (3 < pmVar3[uVar12].f - 1) goto LAB_00427fbf;
          switch((uint)pmVar3[uVar12].f) {
          case 1:
            paVar5->pcData[uVar7].g = pmVar3[uVar12].d[uVar8];
            uVar8 = uVar8 + 1;
            break;
          case 2:
            uVar10 = uVar8 + 1;
            paVar5->pcData[uVar7].g = pmVar3[uVar12].d[uVar8];
            puVar9 = pmVar3[uVar12].d;
            uVar8 = uVar8 + 2;
            goto LAB_00427fb4;
          case 3:
            paVar5->pcData[uVar7].r = pmVar3[uVar12].d[uVar8];
            paVar5->pcData[uVar7].g = pmVar3[uVar12].d[uVar8 + 1];
            paVar5->pcData[uVar7].b = pmVar3[uVar12].d[uVar8 + 2];
            paVar5->pcData[uVar7].a = 0xff;
            uVar8 = uVar8 + 3;
            break;
          case 4:
            paVar5->pcData[uVar7].r = pmVar3[uVar12].d[uVar8];
            paVar5->pcData[uVar7].g = pmVar3[uVar12].d[uVar8 + 1];
            uVar10 = uVar8 + 3;
            paVar5->pcData[uVar7].b = pmVar3[uVar12].d[uVar8 + 2];
            puVar9 = pmVar3[uVar12].d;
            uVar8 = uVar8 + 4;
LAB_00427fb4:
            paVar5->pcData[uVar7].a = puVar9[uVar10];
          }
LAB_00427fbf:
          uVar10 = paVar5->mWidth;
          uVar11 = paVar5->mHeight;
        }
      }
      local_490->mScene->mTextures[local_488] = paVar5;
      uVar12 = local_488 + 1;
    }
  }
  return;
}

Assistant:

void M3DImporter::importTextures(const M3DWrapper &m3d) {
	unsigned int i;
	const char *formatHint[] = { "rgba0800", "rgba0808", "rgba8880", "rgba8888" };
	m3dtx_t *t;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumTextures = m3d->numtexture;
	ASSIMP_LOG_DEBUG_F("M3D: importTextures ", mScene->mNumTextures);

	if (!m3d->numtexture)
		return;

	mScene->mTextures = new aiTexture *[m3d->numtexture];
	for (i = 0; i < m3d->numtexture; i++) {
		unsigned int j, k;
		t = &m3d->texture[i];
		aiTexture *tx = new aiTexture;
		tx->mFilename = aiString(std::string(t->name) + ".png");
		if (!t->w || !t->h || !t->f || !t->d) {
			/* without ASSIMP_USE_M3D_READFILECB, we only have the filename, but no texture data ever */
			tx->mWidth = 0;
			tx->mHeight = 0;
			memcpy(tx->achFormatHint, "png\000", 4);
			tx->pcData = nullptr;
		} else {
			/* if we have the texture loaded, set format hint and pcData too */
			tx->mWidth = t->w;
			tx->mHeight = t->h;
			strcpy(tx->achFormatHint, formatHint[t->f - 1]);
			tx->pcData = new aiTexel[tx->mWidth * tx->mHeight];
			for (j = k = 0; j < tx->mWidth * tx->mHeight; j++) {
				switch (t->f) {
					case 1: tx->pcData[j].g = t->d[k++]; break;
					case 2:
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
					case 3:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = 255;
						break;
					case 4:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
				}
			}
		}
		mScene->mTextures[i] = tx;
	}
}